

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r3d.hpp
# Opt level: O0

void r3d::clip<3>(Polytope<3> *poly,Plane<3> *planes,Int nplanes)

{
  double dVar1;
  int iVar2;
  Real RVar3;
  Vector<3> local_6d0;
  Vector<3> local_6b8;
  Vector<3> local_6a0;
  Vector<3> local_678;
  Vector<3> local_660;
  int local_648 [2];
  Int clipped [128];
  Real smax;
  Real smin;
  Real sdists [128];
  Int numunclipped;
  Int vnext;
  Int vcur;
  Int onv;
  Int np;
  Int p;
  Int v;
  Int nplanes_local;
  Plane<3> *planes_local;
  Polytope<3> *poly_local;
  
  if (0 < poly->nverts) {
    for (onv = 0; onv < nplanes; onv = onv + 1) {
      iVar2 = poly->nverts;
      smax = ArithTraits<double>::max();
      clipped._504_8_ = ArithTraits<double>::min();
      memset(local_648,0,0x200);
      for (np = 0; np < iVar2; np = np + 1) {
        dVar1 = planes[onv].d;
        Vector<3>::Vector(&local_660,&poly->verts[np].pos);
        Vector<3>::Vector(&local_678,&planes[onv].n);
        RVar3 = operator*(&local_660,&local_678);
        sdists[(long)np + -1] = dVar1 + RVar3;
        Vector<3>::~Vector(&local_678);
        Vector<3>::~Vector(&local_660);
        if (sdists[(long)np + -1] < smax) {
          smax = sdists[(long)np + -1];
        }
        if ((double)clipped._504_8_ < sdists[(long)np + -1]) {
          clipped._504_8_ = sdists[(long)np + -1];
        }
        if (sdists[(long)np + -1] <= 0.0 && sdists[(long)np + -1] != 0.0) {
          clipped[(long)np + -2] = 1;
        }
      }
      if (smax < 0.0) {
        if ((double)clipped._504_8_ <= 0.0) {
          poly->nverts = 0;
          return;
        }
        for (numunclipped = 0; numunclipped < iVar2; numunclipped = numunclipped + 1) {
          if (clipped[(long)numunclipped + -2] == 0) {
            for (vcur = 0; vcur < 3; vcur = vcur + 1) {
              sdists[0x7f]._4_4_ = poly->verts[numunclipped].pnbrs[vcur];
              if (clipped[(long)sdists[0x7f]._4_4_ + -2] != 0) {
                ClipHelper<3>::init_new_vert_link(poly,numunclipped,vcur);
                poly->verts[numunclipped].pnbrs[vcur] = poly->nverts;
                Vector<3>::Vector(&local_6b8,&poly->verts[numunclipped].pos);
                RVar3 = sdists[(long)sdists[0x7f]._4_4_ + -1];
                Vector<3>::Vector(&local_6d0,&poly->verts[sdists[0x7f]._4_4_].pos);
                wav<3>(&local_6a0,&local_6b8,-RVar3,&local_6d0,sdists[(long)numunclipped + -1]);
                Vector<3>::operator=(&poly->verts[poly->nverts].pos,&local_6a0);
                Vector<3>::~Vector(&local_6a0);
                Vector<3>::~Vector(&local_6d0);
                Vector<3>::~Vector(&local_6b8);
                poly->nverts = poly->nverts + 1;
              }
            }
          }
        }
        ClipHelper<3>::finalize_links(iVar2,poly);
        sdists[0x7f]._0_4_ = 0;
        for (np = 0; np < poly->nverts; np = np + 1) {
          if (clipped[(long)np + -2] == 0) {
            Vertex<3>::operator=(poly->verts + sdists[0x7f]._0_4_,poly->verts + np);
            iVar2 = sdists[0x7f]._0_4_;
            sdists[0x7f]._0_4_ = sdists[0x7f]._0_4_ + 1;
            clipped[(long)np + -2] = iVar2;
          }
        }
        poly->nverts = sdists[0x7f]._0_4_;
        for (np = 0; np < poly->nverts; np = np + 1) {
          for (vcur = 0; vcur < 3; vcur = vcur + 1) {
            poly->verts[np].pnbrs[vcur] = clipped[(long)poly->verts[np].pnbrs[vcur] + -2];
          }
        }
      }
    }
  }
  return;
}

Assistant:

R3D_INLINE void clip(
    Polytope<dim>& poly, Plane<dim> const* planes, Int nplanes) {
  if (poly.nverts <= 0) return;

  // variable declarations
  Int v, p, np, onv, vcur, vnext, numunclipped;

  // signed distances to the clipping plane
  Real sdists[Polytope<dim>::max_verts];
  Real smin, smax;

  // loop over each clip plane
  for (p = 0; p < nplanes; ++p) {
    // calculate signed distances to the clip plane
    onv = poly.nverts;
    smin = ArithTraits<Real>::max();
    smax = ArithTraits<Real>::min();

    // for marking clipped vertices
    Int clipped[MaxVerts<dim>::value] = {};  // all initialized to zero
    for (v = 0; v < onv; ++v) {
      sdists[v] = planes[p].d + (poly.verts[v].pos * planes[p].n);
      if (sdists[v] < smin) smin = sdists[v];
      if (sdists[v] > smax) smax = sdists[v];
      if (sdists[v] < 0.0) clipped[v] = 1;
    }

    // skip this face if the poly lies entirely on one side of it
    if (smin >= 0.0) continue;
    if (smax <= 0.0) {
      poly.nverts = 0;
      return;
    }

    // check all edges and insert new vertices on the bisected edges
    for (vcur = 0; vcur < onv; ++vcur) {
      if (clipped[vcur]) continue;
      for (np = 0; np < dim; ++np) {
        vnext = poly.verts[vcur].pnbrs[np];
        if (!clipped[vnext]) continue;
        ClipHelper<dim>::init_new_vert_link(poly, vcur, np);
        poly.verts[vcur].pnbrs[np] = poly.nverts;
        poly.verts[poly.nverts].pos = wav(poly.verts[vcur].pos, -sdists[vnext],
            poly.verts[vnext].pos, sdists[vcur]);
        ++(poly.nverts);
      }
    }

    // for each new vert, search around the poly for its new neighbors
    // and doubly-link everything
    ClipHelper<dim>::finalize_links(onv, poly);

    // go through and compress the vertex list, removing clipped verts
    // and re-indexing accordingly (reusing `clipped` to re-index everything)
    numunclipped = 0;
    for (v = 0; v < poly.nverts; ++v) {
      if (!clipped[v]) {
        poly.verts[numunclipped] = poly.verts[v];
        clipped[v] = numunclipped++;
      }
    }
    poly.nverts = numunclipped;
    for (v = 0; v < poly.nverts; ++v)
      for (np = 0; np < dim; ++np)
        poly.verts[v].pnbrs[np] = clipped[poly.verts[v].pnbrs[np]];
  }
}